

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hsort_template.h
# Opt level: O0

void ON_hsort_uint(uint *base,size_t nel)

{
  size_t sVar1;
  uint local_54;
  uint *puStack_50;
  uint tmp;
  uint *e_j;
  uint *e_i;
  uint *e_end;
  size_t j;
  size_t i;
  size_t k;
  size_t i_end;
  size_t nel_local;
  uint *base_local;
  
  if ((base != (uint *)0x0) && (1 < nel)) {
    i = nel >> 1;
    k = nel - 1;
    e_i = base + k;
    do {
      if (i == 0) {
        local_54 = *e_i;
        *e_i = *base;
        k = k - 1;
        if (k == 0) {
          *base = local_54;
          return;
        }
        e_i = e_i + -1;
      }
      else {
        i = i - 1;
        local_54 = base[i];
      }
      e_j = base + i;
      sVar1 = i * 2;
      while (e_end = (uint *)(sVar1 + 1), e_end <= k) {
        puStack_50 = base + (long)e_end;
        if ((e_end < k) && (*puStack_50 < puStack_50[1])) {
          e_end = (uint *)(sVar1 + 2);
          puStack_50 = puStack_50 + 1;
        }
        sVar1 = k;
        if (local_54 < *puStack_50) {
          *e_j = *puStack_50;
          e_j = puStack_50;
          sVar1 = (long)e_end * 2;
        }
      }
      *e_j = local_54;
    } while( true );
  }
  return;
}

Assistant:

void
ON_HSORT_FNAME( ON_SORT_TEMPLATE_TYPE* base, size_t nel )
{
  size_t i_end,k,i,j;
  ON_SORT_TEMPLATE_TYPE* e_end;
  ON_SORT_TEMPLATE_TYPE* e_i;
  ON_SORT_TEMPLATE_TYPE* e_j;
  ON_SORT_TEMPLATE_TYPE tmp;

  if (0 == base || nel < 2)
    return;

  k = nel >> 1;
  i_end = nel-1;
  e_end = base + i_end;
  for (;;) 
  {
    if (k)
    {
      --k;
      ON_HSORT_TO_TMP((base+k));  /* e_tmp = e[k]; */
    } 
    else
    {      
      ON_HSORT_TO_TMP(e_end);     /* e_tmp = e[i_end]; */
      ON_HSORT_COPY(e_end,base);  /* e[i_end] = e[0];  */
      if (!(--i_end))
      {
        ON_HSORT_FROM_TMP(base);  /* e[0] = e_tmp;     */
        break;
      }
      e_end--;
    }

    i = k;
    j = (k<<1) + 1;
    e_i = base + i;
    while (j <= i_end) 
    {
      e_j = base + j;
      if (j < i_end && ON_HSORT_GT((e_j+1),e_j) /*e[j] < e[j + 1] */)
      {
        j++;
        e_j++;
      }
      if (ON_HSORT_GT_TMP(e_j) /* tmp < e[j] */) 
      {
        ON_HSORT_COPY(e_i,e_j);  /* e[i] = e[j]; */
        i = j;
        e_i = e_j;
        j = (j<<1) + 1;
      }
      else
        j = i_end + 1;
    }

    ON_HSORT_FROM_TMP(e_i); /* e[i] = e_tmp; */
  }
}